

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_format_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_uncompressed_pixel_format dst_format,
          void *dst,rf_int dst_size)

{
  long lVar1;
  rf_source_location source_location;
  rf_image image_00;
  rf_pixel_format src_format;
  _Bool _Var2;
  int iVar3;
  long *in_FS_OFFSET;
  void *src;
  undefined4 uStack_94;
  undefined4 uStack_5c;
  undefined4 uStack_2c;
  _Bool success;
  rf_int dst_size_local;
  void *dst_local;
  rf_uncompressed_pixel_format dst_format_local;
  
  memset(__return_storage_ptr__,0,0x18);
  if (((undefined1  [24])image & (undefined1  [24])0x100000000) == (undefined1  [24])0x0) {
    rf_log_impl(8,0x1b291e,(char *)0x1);
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_image_format_to_buffer";
    *(undefined8 *)(lVar1 + -0x450) = 0x3e94;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_94,1);
  }
  else {
    _Var2 = rf_is_uncompressed_format(dst_format);
    src_format = image.format;
    if ((_Var2) && (_Var2 = rf_is_uncompressed_format(image.format), _Var2)) {
      image_00._16_8_ = image.data;
      image_00._0_16_ = image._8_16_;
      src = image.data;
      iVar3 = rf_image_size(image_00);
      rf_format_pixels(src,(long)iVar3,src_format,dst,dst_size,dst_format);
      __return_storage_ptr__->data = dst;
      __return_storage_ptr__->width = image.width;
      __return_storage_ptr__->height = image.height;
      __return_storage_ptr__->format = dst_format;
      __return_storage_ptr__->valid = true;
      *(undefined3 *)&__return_storage_ptr__->field_0x15 = uStack_2c._1_3_;
    }
    else {
      source_location.proc_name = "rf_image_format_to_buffer";
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.line_in_file = 0x3e92;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                  "Cannot format compressed pixel formats. Image format: %d, Destination format: %d."
                  ,1,(ulong)image.format,(ulong)dst_format,"rf_image_format_to_buffer");
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_image_format_to_buffer";
      *(undefined8 *)(lVar1 + -0x450) = 0x3e92;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_5c,1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_format_to_buffer(rf_image image, rf_uncompressed_pixel_format dst_format, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (rf_is_uncompressed_format(dst_format) && rf_is_uncompressed_format(image.format))
        {
            bool success = rf_format_pixels(image.data, rf_image_size(image), image.format, dst, dst_size, dst_format);
            RF_ASSERT(success);

            result = (rf_image)
            {
                .data = dst,
                .width = image.width,
                .height = image.height,
                .format = dst_format,
                .valid = true,
            };
        }
        else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Cannot format compressed pixel formats. Image format: %d, Destination format: %d.", image.format, dst_format);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}